

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

bool __thiscall
soplex::SPxLPBase<double>::readMPS
          (SPxLPBase<double> *this,istream *p_input,NameSet *p_rnames,NameSet *p_cnames,
          DIdxSet *p_intvars)

{
  LPColSetBase<double> *this_00;
  VectorBase<double> *pVVar1;
  _func_int *p_Var2;
  char cVar3;
  ostream *poVar4;
  double dVar5;
  double dVar6;
  NameSet *pNVar7;
  NameSet *this_01;
  bool bVar8;
  int iVar9;
  uint uVar10;
  double *pdVar11;
  char *pcVar12;
  long *plVar13;
  size_t sVar14;
  pointer pdVar15;
  SPxOut *pSVar16;
  int __c;
  char *pcVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  _func_int *p_Var21;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  char colname [256];
  _func_int *local_658;
  undefined4 local_638;
  undefined4 uStack_634;
  NameSet *local_620;
  undefined8 local_618;
  undefined8 uStack_610;
  SPxOut *local_600;
  NameSet *local_5f8;
  SPxLPBase<double> *local_5f0;
  DIdxSet *local_5e8;
  DataKey local_5e0;
  DSVectorBase<double> local_5d8;
  LPColSetBase<double> *local_5b8;
  NameSet *local_5b0;
  NameSet *local_5a8;
  SPxOut *local_5a0;
  MPSInput local_598;
  LPColBase<double> local_238 [4];
  LPRowBase<double> local_138 [4];
  undefined1 local_39;
  
  local_5e8 = p_intvars;
  local_5b0 = p_cnames;
  if (p_cnames == (NameSet *)0x0) {
    local_620 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_620,1);
    p_cnames = local_620;
    NameSet::NameSet(local_620,10000,-1,2.0,2.0);
  }
  local_620 = p_cnames;
  NameSet::clear(p_cnames);
  local_5a8 = p_rnames;
  if (p_rnames == (NameSet *)0x0) {
    local_5f8 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_5f8,1);
    p_rnames = local_5f8;
    NameSet::NameSet(local_5f8,10000,-1,2.0,2.0);
  }
  this_00 = &this->super_LPColSetBase<double>;
  local_5f8 = p_rnames;
  NameSet::clear(p_rnames);
  LPRowSetBase<double>::clear(&this->super_LPRowSetBase<double>);
  LPColSetBase<double>::clear(this_00);
  this->thesense = MAXIMIZE;
  this->offset = 0.0;
  this->_isScaled = false;
  this->lp_scaler = (SPxScaler<double> *)0x0;
  (this->super_LPColSetBase<double>).scaleExp.thesize = 0;
  (this->super_LPRowSetBase<double>).scaleExp.thesize = 0;
  SVSetBase<double>::memRemax(&this_00->super_SVSetBase<double>,100000);
  local_5b8 = this_00;
  LPColSetBase<double>::reMax(this_00,10000);
  local_598._vptr_MPSInput = (_func_int **)&PTR__MPSInput_003aea20;
  local_598.m_section = NAME;
  local_598.m_lineno = 0;
  local_598.m_objsense = MINIMIZE;
  local_598.m_has_error = false;
  local_598.m_buf[0] = '\0';
  local_598.m_is_integer = false;
  local_598.m_is_new_format = false;
  local_598.m_ignored = 0;
  local_598.m_objname[0] = '\0';
  local_598.m_f0 = (char *)0x0;
  local_598.m_f1 = (char *)0x0;
  local_598.m_f2 = (char *)0x0;
  local_598.m_f3 = (char *)0x0;
  local_598.m_f4 = (char *)0x0;
  local_598.m_f5 = (char *)0x0;
  local_598.m_probname[0] = '\0';
  local_598.m_input = p_input;
  MPSreadName(&local_598,this->spxout);
  if (local_598.m_section == OBJSEN) {
    MPSreadObjsen(&local_598);
  }
  if (local_598.m_section == OBJNAME) {
    bVar8 = MPSInput::readLine(&local_598);
    if ((!bVar8) || (local_598.m_f1 == (char *)0x0)) {
LAB_001d1cde:
      MPSInput::syntaxError(&local_598);
      goto LAB_001d1cf2;
    }
    spxSnprintf(local_598.m_objname,0x100,"%s");
    bVar8 = MPSInput::readLine(&local_598);
    if ((!bVar8) ||
       ((local_598.m_f0 == (char *)0x0 || (iVar9 = strcmp(local_598.m_f0,"ROWS"), iVar9 != 0))))
    goto LAB_001d1cde;
    local_598.m_section = ROWS;
  }
  else {
LAB_001d1cf2:
    if (local_598.m_section != ROWS) goto LAB_001d1fbe;
  }
  pNVar7 = local_5f8;
  pSVar16 = this->spxout;
  LPRowBase<double>::LPRowBase(local_138,0);
  pdVar11 = (double *)__tls_get_addr(&PTR_003b4b70);
  dVar20 = *pdVar11;
  while (bVar8 = MPSInput::readLine(&local_598), bVar8) {
    if (local_598.m_f0 != (char *)0x0) {
      if ((pSVar16 != (SPxOut *)0x0) && (3 < (int)pSVar16->m_verbosity)) {
        local_238[0].up = (double)CONCAT44(local_238[0].up._4_4_,pSVar16->m_verbosity);
        local_5d8._vptr_DSVectorBase = (_func_int **)CONCAT44(local_5d8._vptr_DSVectorBase._4_4_,4);
        (*pSVar16->_vptr_SPxOut[2])(pSVar16);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar16->m_streams[pSVar16->m_verbosity],"IMPSRD02 Objective name : ",0x1a);
        poVar4 = pSVar16->m_streams[pSVar16->m_verbosity];
        sVar14 = strlen(local_598.m_objname);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_598.m_objname,sVar14);
        cVar3 = (char)pSVar16->m_streams[pSVar16->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar16->m_streams[pSVar16->m_verbosity] + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        (*pSVar16->_vptr_SPxOut[2])(pSVar16,local_238);
      }
      iVar9 = strcmp(local_598.m_f0,"COLUMNS");
      if (iVar9 == 0) {
        local_598.m_section = COLUMNS;
        goto LAB_001d1f99;
      }
      break;
    }
    if ((local_598.m_f1 == (char *)0x0) || (local_598.m_f2 == (char *)0x0)) break;
    if (*local_598.m_f1 == 'N') {
      if (local_598.m_objname[0] == '\0') {
        spxSnprintf(local_598.m_objname,0x100,"%s");
      }
    }
    else {
      local_238[0].up = (double)local_598.m_f2;
      pcVar12 = DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::index
                          (&pNVar7->hashtab,(char *)local_238,__c);
      if (-1 < (int)pcVar12) break;
      NameSet::add(pNVar7,local_598.m_f2);
      cVar3 = *local_598.m_f1;
      if (cVar3 == 'E') {
        local_138[0].left = 0.0;
        local_138[0].right = 0.0;
      }
      else if (cVar3 == 'L') {
        ::soplex::infinity::__tls_init();
        local_138[0].right = 0.0;
        local_138[0].left = -dVar20;
      }
      else {
        if (cVar3 != 'G') break;
        local_138[0].left = 0.0;
        ::soplex::infinity::__tls_init();
        local_138[0].right = dVar20;
      }
      local_238[0].up = -NAN;
      LPRowSetBase<double>::add(&this->super_LPRowSetBase<double>,(DataKey *)local_238,local_138);
    }
  }
  MPSInput::syntaxError(&local_598);
LAB_001d1f99:
  local_138[0].vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003ae9c8;
  if (local_138[0].vec.theelem != (Nonzero<double> *)0x0) {
    free(local_138[0].vec.theelem);
  }
LAB_001d1fbe:
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])(this);
  this_01 = local_5f8;
  pNVar7 = local_620;
  if (local_598.m_section == COLUMNS) {
    iVar9 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
    memset(local_138,0,0x100);
    LPColBase<double>::LPColBase(local_238,iVar9);
    local_5d8.super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
    local_5d8.super_SVectorBase<double>.memsize = 0;
    local_5d8.super_SVectorBase<double>.memused = 0;
    local_5d8._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003ae9c8;
    local_5d8.theelem = (Nonzero<double> *)0x0;
    spx_alloc<soplex::Nonzero<double>*>(&local_5d8.theelem,8);
    local_5d8.super_SVectorBase<double>.m_elem = local_5d8.theelem;
    local_5d8.super_SVectorBase<double>.memsize = 8;
    local_5d8.super_SVectorBase<double>.memused = 0;
    local_238[0].object = 0.0;
    plVar13 = (long *)__tls_get_addr(&PTR_003b4b70);
    pcVar12 = (char *)*plVar13;
    dVar20 = local_238[0].object;
    while (local_238[0].object = dVar20, bVar8 = MPSInput::readLine(&local_598),
          pcVar17 = local_598.m_f1, bVar8) {
      if (local_598.m_f0 != (char *)0x0) {
        iVar9 = strcmp(local_598.m_f0,"RHS");
        if (iVar9 == 0) {
          if (local_138[0].left._0_1_ != '\0') {
            DSVectorBase<double>::operator=(&local_238[0].vec,&local_5d8.super_SVectorBase<double>);
            local_5e0.info = 0;
            local_5e0.idx = -1;
            LPColSetBase<double>::add(local_5b8,&local_5e0,local_238);
          }
          local_598.m_section = RHS;
          goto LAB_001d2464;
        }
        break;
      }
      if (((local_598.m_f1 == (char *)0x0) || (local_598.m_f2 == (char *)0x0)) ||
         (local_598.m_f3 == (char *)0x0)) break;
      iVar9 = strcmp((char *)local_138,local_598.m_f1);
      if (iVar9 != 0) {
        if (local_138[0].left._0_1_ != '\0') {
          DSVectorBase<double>::operator=(&local_238[0].vec,&local_5d8.super_SVectorBase<double>);
          local_5e0.info = 0;
          local_5e0.idx = -1;
          LPColSetBase<double>::add(local_5b8,&local_5e0,local_238);
          pcVar17 = local_598.m_f1;
        }
        spxSnprintf((char *)local_138,0xff,"%s",pcVar17);
        local_39 = 0;
        iVar9 = (pNVar7->set).thesize;
        NameSet::add(pNVar7,(char *)local_138);
        if ((pNVar7->set).thesize <= iVar9) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "ERROR in COLUMNS: duplicate column name or not column-wise ordering",0x43);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
          std::ostream::put('p');
          std::ostream::flush();
          break;
        }
        local_5d8.super_SVectorBase<double>._8_8_ =
             local_5d8.super_SVectorBase<double>._8_8_ & 0xffffffff;
        local_238[0].low = 0.0;
        local_238[0].object = 0.0;
        ::soplex::infinity::__tls_init();
        local_238[0].up = (double)pcVar12;
        if (local_598.m_is_integer == true) {
          if (local_5e8 != (DIdxSet *)0x0) {
            iVar9 = NameSet::number(pNVar7,(char *)local_138);
            DIdxSet::addIdx(local_5e8,iVar9);
          }
          local_238[0].up = 1.0;
        }
      }
      dVar20 = atof(local_598.m_f3);
      pcVar17 = local_598.m_f2;
      iVar9 = strcmp(local_598.m_f2,local_598.m_objname);
      dVar5 = dVar20;
      if (iVar9 != 0) {
        iVar9 = NameSet::number(this_01,pcVar17);
        if (iVar9 < 0) {
          MPSInput::entryIgnored(&local_598,"Column",local_598.m_f1,"row",local_598.m_f2);
          dVar5 = local_238[0].object;
        }
        else if ((dVar20 != 0.0) || (dVar5 = local_238[0].object, NAN(dVar20))) {
          DSVectorBase<double>::makeMem(&local_5d8,1);
          local_5d8.super_SVectorBase<double>.m_elem[local_5d8.super_SVectorBase<double>.memused].
          idx = iVar9;
          local_5d8.super_SVectorBase<double>.m_elem[local_5d8.super_SVectorBase<double>.memused].
          val = dVar20;
          local_5d8.super_SVectorBase<double>.memused =
               local_5d8.super_SVectorBase<double>.memused + 1;
          dVar5 = local_238[0].object;
        }
      }
      local_238[0].object = dVar5;
      dVar20 = local_238[0].object;
      if (local_598.m_f5 != (char *)0x0) {
        dVar5 = atof(local_598.m_f5);
        pcVar17 = local_598.m_f4;
        iVar9 = strcmp(local_598.m_f4,local_598.m_objname);
        dVar20 = dVar5;
        if (iVar9 != 0) {
          iVar9 = NameSet::number(this_01,pcVar17);
          if (iVar9 < 0) {
            MPSInput::entryIgnored(&local_598,"Column",local_598.m_f1,"row",local_598.m_f4);
            dVar20 = local_238[0].object;
          }
          else if ((dVar5 != 0.0) || (dVar20 = local_238[0].object, NAN(dVar5))) {
            DSVectorBase<double>::makeMem(&local_5d8,1);
            local_5d8.super_SVectorBase<double>.m_elem[local_5d8.super_SVectorBase<double>.memused].
            idx = iVar9;
            local_5d8.super_SVectorBase<double>.m_elem[local_5d8.super_SVectorBase<double>.memused].
            val = dVar5;
            local_5d8.super_SVectorBase<double>.memused =
                 local_5d8.super_SVectorBase<double>.memused + 1;
            dVar20 = local_238[0].object;
          }
        }
      }
    }
    MPSInput::syntaxError(&local_598);
LAB_001d2464:
    local_5d8._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003ae9c8;
    if (local_5d8.theelem != (Nonzero<double> *)0x0) {
      free(local_5d8.theelem);
    }
    local_238[0].vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003ae9c8;
    if (local_238[0].vec.theelem != (Nonzero<double> *)0x0) {
      free(local_238[0].vec.theelem);
    }
  }
  pNVar7 = local_5f8;
  if (local_598.m_section == RHS) {
    pSVar16 = this->spxout;
    memset(local_138,0,0x100);
    memset(local_238,0,0x100);
    bVar8 = MPSInput::readLine(&local_598);
    if (bVar8) {
      pdVar11 = (double *)__tls_get_addr(&PTR_003b4b70);
      dVar20 = *pdVar11;
      local_5f0 = this;
      while (local_598.m_f0 == (char *)0x0) {
        if ((local_598.m_f2 != (char *)0x0 && local_598.m_f3 == (char *)0x0) ||
           ((local_598.m_f4 != (char *)0x0 && (local_598.m_f5 == (char *)0x0)))) {
          MPSInput::insertName(&local_598,"_RHS_",false);
        }
        if (((local_598.m_f1 == (char *)0x0) || (local_598.m_f2 == (char *)0x0)) ||
           (local_598.m_f3 == (char *)0x0)) goto LAB_001d29eb;
        if (local_138[0].left._0_1_ == '\0') {
          spxSnprintf((char *)local_138,0x100,"%s",local_598.m_f1);
        }
        pcVar12 = local_598.m_f1;
        iVar9 = strcmp((char *)local_138,local_598.m_f1);
        if (iVar9 == 0) {
          uVar10 = NameSet::number(pNVar7,local_598.m_f2);
          if ((int)uVar10 < 0) {
            MPSInput::entryIgnored(&local_598,"RHS",local_598.m_f1,"row",local_598.m_f2);
          }
          else {
            local_618 = (_func_int *)atof(local_598.m_f3);
            dVar5 = (this->super_LPRowSetBase<double>).right.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar10];
            ::soplex::infinity::__tls_init();
            if (dVar5 < dVar20) {
              (this->super_LPRowSetBase<double>).right.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar10] = (double)local_618;
            }
            dVar5 = (this->super_LPRowSetBase<double>).left.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar10];
            ::soplex::infinity::__tls_init();
            if (-dVar20 < dVar5) {
              (this->super_LPRowSetBase<double>).left.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar10] = (double)local_618;
            }
          }
          if (local_598.m_f5 != (char *)0x0) {
            uVar10 = NameSet::number(pNVar7,local_598.m_f4);
            if ((int)uVar10 < 0) {
              MPSInput::entryIgnored(&local_598,"RHS",local_598.m_f1,"row",local_598.m_f4);
            }
            else {
              local_618 = (_func_int *)atof(local_598.m_f5);
              dVar5 = (this->super_LPRowSetBase<double>).right.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar10];
              ::soplex::infinity::__tls_init();
              if (dVar5 < dVar20) {
                (this->super_LPRowSetBase<double>).right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar10] = (double)local_618;
              }
              dVar5 = (this->super_LPRowSetBase<double>).left.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar10];
              ::soplex::infinity::__tls_init();
              if (-dVar20 < dVar5) {
                (this->super_LPRowSetBase<double>).left.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar10] = (double)local_618;
              }
            }
          }
        }
        else {
          iVar9 = strcmp((char *)local_238,pcVar12);
          if (((iVar9 != 0) &&
              (spxSnprintf((char *)local_238,0x100,"%s",pcVar12), pSVar16 != (SPxOut *)0x0)) &&
             (4 < (int)pSVar16->m_verbosity)) {
            local_5d8._vptr_DSVectorBase =
                 (_func_int **)CONCAT44(local_5d8._vptr_DSVectorBase._4_4_,pSVar16->m_verbosity);
            local_5e0.info = 5;
            (*pSVar16->_vptr_SPxOut[2])(pSVar16,&local_5e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (pSVar16->m_streams[pSVar16->m_verbosity],"IMPSRD07 RHS ignored    : ",0x1a);
            poVar4 = pSVar16->m_streams[pSVar16->m_verbosity];
            sVar14 = strlen((char *)local_238);
            this = local_5f0;
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_238,sVar14);
            cVar3 = (char)pSVar16->m_streams[pSVar16->m_verbosity];
            std::ios::widen((char)*(undefined8 *)
                                   (*(long *)pSVar16->m_streams[pSVar16->m_verbosity] + -0x18) +
                            cVar3);
            std::ostream::put(cVar3);
            std::ostream::flush();
            (*pSVar16->_vptr_SPxOut[2])(pSVar16);
          }
        }
        bVar8 = MPSInput::readLine(&local_598);
        if (!bVar8) goto LAB_001d29eb;
      }
      if ((pSVar16 != (SPxOut *)0x0) && (3 < (int)pSVar16->m_verbosity)) {
        local_5d8._vptr_DSVectorBase =
             (_func_int **)CONCAT44(local_5d8._vptr_DSVectorBase._4_4_,pSVar16->m_verbosity);
        local_5e0.info = 4;
        (*pSVar16->_vptr_SPxOut[2])(pSVar16);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar16->m_streams[pSVar16->m_verbosity],"IMPSRD03 RHS name       : ",0x1a);
        poVar4 = pSVar16->m_streams[pSVar16->m_verbosity];
        sVar14 = strlen((char *)local_138);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_138,sVar14);
        cVar3 = (char)pSVar16->m_streams[pSVar16->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar16->m_streams[pSVar16->m_verbosity] + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        (*pSVar16->_vptr_SPxOut[2])(pSVar16,&local_5d8);
      }
      pcVar12 = local_598.m_f0;
      iVar9 = strcmp(local_598.m_f0,"RANGES");
      if (iVar9 == 0) {
        local_598.m_section = RANGES;
        goto LAB_001d29ff;
      }
      iVar9 = strcmp(pcVar12,"BOUNDS");
      if (iVar9 == 0) {
        local_598.m_section = BOUNDS;
        goto LAB_001d29ff;
      }
      iVar9 = strcmp(pcVar12,"ENDATA");
      if (iVar9 == 0) {
        local_598.m_section = ENDATA;
        goto LAB_001d29ff;
      }
    }
LAB_001d29eb:
    MPSInput::syntaxError(&local_598);
  }
LAB_001d29ff:
  pNVar7 = local_5f8;
  if (local_598.m_section == RANGES) {
    pSVar16 = this->spxout;
    memset(local_138,0,0x100);
    bVar8 = MPSInput::readLine(&local_598);
    local_600 = pSVar16;
    if (bVar8) {
      pdVar11 = (double *)__tls_get_addr(&PTR_003b4b70);
      local_618 = (_func_int *)*pdVar11;
      uStack_610 = 0;
      dVar20 = -(double)local_618;
      while (pSVar16 = local_600, local_598.m_f0 == (char *)0x0) {
        if ((local_598.m_f2 != (char *)0x0 && local_598.m_f3 == (char *)0x0) ||
           ((local_598.m_f4 != (char *)0x0 && (local_598.m_f5 == (char *)0x0)))) {
          MPSInput::insertName(&local_598,"_RNG_",false);
        }
        if (((local_598.m_f1 == (char *)0x0) || (local_598.m_f2 == (char *)0x0)) ||
           (local_598.m_f3 == (char *)0x0)) goto LAB_001d2f07;
        if (local_138[0].left._0_1_ == '\0') {
          spxSnprintf((char *)local_138,0x100,"%s");
        }
        iVar9 = strcmp((char *)local_138,local_598.m_f1);
        if (iVar9 == 0) {
          uVar10 = NameSet::number(pNVar7,local_598.m_f2);
          if ((int)uVar10 < 0) {
            MPSInput::entryIgnored(&local_598,"Range",local_598.m_f1,"row",local_598.m_f2);
          }
          else {
            dVar6 = atof(local_598.m_f3);
            dVar5 = (this->super_LPRowSetBase<double>).left.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar10];
            ::soplex::infinity::__tls_init();
            if ((dVar5 <= dVar20) ||
               (dVar5 = (this->super_LPRowSetBase<double>).right.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar10], ::soplex::infinity::__tls_init(),
               (double)local_618 <= dVar5)) {
              dVar5 = (this->super_LPRowSetBase<double>).left.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar10];
              ::soplex::infinity::__tls_init();
              if (dVar20 < dVar5) {
                (this->super_LPRowSetBase<double>).right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar10] =
                     ABS(dVar6) +
                     (this->super_LPRowSetBase<double>).left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10];
                goto LAB_001d2ca3;
              }
              pdVar15 = (this->super_LPRowSetBase<double>).left.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              dVar6 = (this->super_LPRowSetBase<double>).right.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar10] - ABS(dVar6);
            }
            else {
              if (0.0 <= dVar6) {
                pdVar15 = (this->super_LPRowSetBase<double>).right.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              else {
                pdVar15 = (this->super_LPRowSetBase<double>).left.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              dVar6 = pdVar15[uVar10] + dVar6;
            }
            pdVar15[uVar10] = dVar6;
          }
LAB_001d2ca3:
          if (local_598.m_f5 != (char *)0x0) {
            uVar10 = NameSet::number(pNVar7,local_598.m_f4);
            if ((int)uVar10 < 0) {
              MPSInput::entryIgnored(&local_598,"Range",local_598.m_f1,"row",local_598.m_f4);
            }
            else {
              dVar6 = atof(local_598.m_f5);
              dVar5 = (this->super_LPRowSetBase<double>).left.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar10];
              ::soplex::infinity::__tls_init();
              if ((dVar5 <= dVar20) ||
                 (dVar5 = (this->super_LPRowSetBase<double>).right.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar10], ::soplex::infinity::__tls_init()
                 , (double)local_618 <= dVar5)) {
                dVar5 = (this->super_LPRowSetBase<double>).left.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar10];
                ::soplex::infinity::__tls_init();
                if (dVar20 < dVar5) {
                  (this->super_LPRowSetBase<double>).right.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10] =
                       ABS(dVar6) +
                       (this->super_LPRowSetBase<double>).left.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10];
                  goto LAB_001d2b44;
                }
                pdVar15 = (this->super_LPRowSetBase<double>).left.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                dVar6 = (this->super_LPRowSetBase<double>).right.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar10] - ABS(dVar6);
              }
              else {
                if (0.0 <= dVar6) {
                  pdVar15 = (this->super_LPRowSetBase<double>).right.val.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                }
                else {
                  pdVar15 = (this->super_LPRowSetBase<double>).left.val.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                }
                dVar6 = pdVar15[uVar10] + dVar6;
              }
              pdVar15[uVar10] = dVar6;
            }
          }
        }
LAB_001d2b44:
        bVar8 = MPSInput::readLine(&local_598);
        if (!bVar8) goto LAB_001d2f07;
      }
      if ((local_600 != (SPxOut *)0x0) && (3 < (int)local_600->m_verbosity)) {
        local_238[0].up = (double)CONCAT44(local_238[0].up._4_4_,local_600->m_verbosity);
        local_5d8._vptr_DSVectorBase = (_func_int **)CONCAT44(local_5d8._vptr_DSVectorBase._4_4_,4);
        (*local_600->_vptr_SPxOut[2])(local_600);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar16->m_streams[pSVar16->m_verbosity],"IMPSRD04 Range name     : ",0x1a);
        poVar4 = pSVar16->m_streams[pSVar16->m_verbosity];
        sVar14 = strlen((char *)local_138);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_138,sVar14);
        cVar3 = (char)pSVar16->m_streams[pSVar16->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar16->m_streams[pSVar16->m_verbosity] + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        (*pSVar16->_vptr_SPxOut[2])(pSVar16,local_238);
      }
      pcVar12 = local_598.m_f0;
      iVar9 = strcmp(local_598.m_f0,"BOUNDS");
      if (iVar9 == 0) {
        local_598.m_section = BOUNDS;
        goto LAB_001d2f1b;
      }
      iVar9 = strcmp(pcVar12,"ENDATA");
      if (iVar9 == 0) {
        local_598.m_section = ENDATA;
        goto LAB_001d2f1b;
      }
    }
LAB_001d2f07:
    MPSInput::syntaxError(&local_598);
  }
LAB_001d2f1b:
  pNVar7 = local_620;
  if (local_598.m_section == BOUNDS) {
    local_5a0 = this->spxout;
    DIdxSet::DIdxSet((DIdxSet *)local_238,8);
    memset(local_138,0,0x100);
    pdVar11 = (double *)__tls_get_addr(&PTR_003b4b70);
    p_Var2 = (_func_int *)*pdVar11;
    uStack_610 = 0;
    p_Var21 = (_func_int *)((ulong)p_Var2 ^ 0x8000000000000000);
    pVVar1 = &(this->super_LPColSetBase<double>).up;
    local_600 = (SPxOut *)&(this->super_LPColSetBase<double>).low;
    local_618 = p_Var2;
    local_5f0 = this;
LAB_001d2fb9:
    bVar8 = MPSInput::readLine(&local_598);
    pSVar16 = local_5a0;
    if (bVar8) {
      if (local_598.m_f0 != (char *)0x0) {
        if ((local_5a0 != (SPxOut *)0x0) && (3 < (int)local_5a0->m_verbosity)) {
          local_5d8._vptr_DSVectorBase =
               (_func_int **)CONCAT44(local_5d8._vptr_DSVectorBase._4_4_,local_5a0->m_verbosity);
          local_5e0.info = 4;
          (*local_5a0->_vptr_SPxOut[2])(local_5a0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar16->m_streams[pSVar16->m_verbosity],"IMPSRD05 Bound name     : ",0x1a);
          poVar4 = pSVar16->m_streams[pSVar16->m_verbosity];
          sVar14 = strlen((char *)local_138);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_138,sVar14);
          cVar3 = (char)pSVar16->m_streams[pSVar16->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar16->m_streams[pSVar16->m_verbosity] + -0x18) + cVar3
                         );
          std::ostream::put(cVar3);
          std::ostream::flush();
          (*pSVar16->_vptr_SPxOut[2])(pSVar16,&local_5d8);
        }
        iVar9 = strcmp(local_598.m_f0,"ENDATA");
        if (iVar9 == 0) {
          local_598.m_section = ENDATA;
          goto LAB_001d3519;
        }
        goto switchD_001d32e3_caseD_4e;
      }
      cVar3 = *local_598.m_f1;
      pcVar12 = local_598.m_f3;
      pcVar17 = local_598.m_f2;
      if (cVar3 == 'F') {
        if (local_598.m_f1[1] == 'X') goto LAB_001d301a;
      }
      else if (cVar3 == 'U') {
        if ((local_598.m_f1[1] == 'I') || (local_598.m_f1[1] == 'P')) goto LAB_001d301a;
      }
      else if ((cVar3 == 'L') && ((local_598.m_f1[1] == 'I' || (local_598.m_f1[1] == 'O')))) {
LAB_001d301a:
        if (local_598.m_f1[2] == '\0') {
          pcVar12 = local_598.m_f4;
          pcVar17 = local_598.m_f3;
        }
      }
      if ((((pcVar17 != (char *)0x0) && (pcVar12 == (char *)0x0)) &&
          (MPSInput::insertName(&local_598,"_BND_",true), local_598.m_f1 == (char *)0x0)) ||
         ((local_598.m_f2 == (char *)0x0 || (local_598.m_f3 == (char *)0x0))))
      goto switchD_001d32e3_caseD_4e;
      if (local_138[0].left._0_1_ == '\0') {
        spxSnprintf((char *)local_138,0x100,"%s");
      }
      iVar9 = strcmp((char *)local_138,local_598.m_f2);
      if (iVar9 == 0) {
        uVar10 = NameSet::number(pNVar7,local_598.m_f3);
        pcVar12 = local_598.m_f4;
        if (-1 < (int)uVar10) {
          if (local_598.m_f4 == (char *)0x0) {
            uVar18 = 0;
            uVar19 = 0;
LAB_001d3208:
            this = local_5f0;
            local_658 = (_func_int *)CONCAT44(uVar19,uVar18);
          }
          else {
            iVar9 = strcmp(local_598.m_f4,"-Inf");
            if ((iVar9 == 0) || (iVar9 = strcmp(pcVar12,"-inf"), iVar9 == 0)) {
              this = local_5f0;
              ::soplex::infinity::__tls_init();
              local_658 = p_Var21;
            }
            else {
              iVar9 = strcmp(pcVar12,"Inf");
              if ((((iVar9 != 0) && (iVar9 = strcmp(pcVar12,"inf"), iVar9 != 0)) &&
                  (iVar9 = strcmp(pcVar12,"+Inf"), iVar9 != 0)) &&
                 (iVar9 = strcmp(pcVar12,"+inf"), iVar9 != 0)) {
                dVar20 = atof(pcVar12);
                uVar18 = SUB84(dVar20,0);
                uVar19 = (undefined4)((ulong)dVar20 >> 0x20);
                goto LAB_001d3208;
              }
              this = local_5f0;
              ::soplex::infinity::__tls_init();
              local_658 = local_618;
            }
          }
          if (local_598.m_f1[1] == 'I') {
            if (local_5e8 != (DIdxSet *)0x0) {
              DIdxSet::addIdx(local_5e8,uVar10);
            }
            iVar9 = IdxSet::pos((IdxSet *)local_238,uVar10);
            if (iVar9 < 0) {
              ::soplex::infinity::__tls_init();
              (pVVar1->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10] = (double)local_618;
              DIdxSet::addIdx((DIdxSet *)local_238,uVar10);
            }
          }
          cVar3 = *local_598.m_f1;
          pSVar16 = (SPxOut *)pVVar1;
          switch(cVar3) {
          case 'L':
            pSVar16 = local_600;
            break;
          case 'M':
            ::soplex::infinity::__tls_init();
            local_638 = SUB84(p_Var2,0);
            uStack_634 = (undefined4)((ulong)p_Var21 >> 0x20);
            pSVar16 = local_600;
            goto LAB_001d3369;
          case 'N':
          case 'O':
          case 'Q':
          case 'R':
          case 'S':
          case 'T':
            goto switchD_001d32e3_caseD_4e;
          case 'P':
            ::soplex::infinity::__tls_init();
            local_638 = (undefined4)local_618;
            uStack_634 = local_618._4_4_;
LAB_001d3369:
            local_658 = (_func_int *)CONCAT44(uStack_634,local_638);
            break;
          case 'U':
            break;
          default:
            if (cVar3 == 'B') {
              local_600->_vptr_SPxOut[uVar10] = (_func_int *)0x0;
              (pVVar1->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10] = 1.0;
              if (local_5e8 != (DIdxSet *)0x0) {
                DIdxSet::addIdx(local_5e8,uVar10);
              }
              goto LAB_001d2fb9;
            }
            if (cVar3 != 'F') goto switchD_001d32e3_caseD_4e;
            if (local_598.m_f1[1] == 'X') {
              local_600->_vptr_SPxOut[uVar10] = local_658;
            }
            else {
              ::soplex::infinity::__tls_init();
              local_600->_vptr_SPxOut[uVar10] = p_Var21;
              ::soplex::infinity::__tls_init();
              local_658 = local_618;
            }
          }
          pSVar16->_vptr_SPxOut[uVar10] = local_658;
          goto LAB_001d2fb9;
        }
        MPSInput::entryIgnored(&local_598,"column",local_598.m_f3,"bound",(char *)local_138);
      }
      goto LAB_001d2fb9;
    }
switchD_001d32e3_caseD_4e:
    MPSInput::syntaxError(&local_598);
LAB_001d3519:
    DIdxSet::~DIdxSet((DIdxSet *)local_238);
  }
  if (local_598.m_section != ENDATA) {
    MPSInput::syntaxError(&local_598);
  }
  if (local_598.m_has_error == true) {
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x1b])(this);
  }
  else {
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x45])
              (this,(ulong)(((local_598.m_objsense != MINIMIZE) - 1) +
                           (uint)(local_598.m_objsense != MINIMIZE)));
    pSVar16 = this->spxout;
    if ((pSVar16 != (SPxOut *)0x0) && (3 < (int)pSVar16->m_verbosity)) {
      local_138[0].left = (double)CONCAT44(local_138[0].left._4_4_,pSVar16->m_verbosity);
      local_238[0].up = (double)CONCAT44(local_238[0].up._4_4_,4);
      (*pSVar16->_vptr_SPxOut[2])();
      pSVar16 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar16->m_streams[pSVar16->m_verbosity],"IMPSRD06 Objective sense: ",0x1a);
      pcVar12 = "Maximize\n";
      if (local_598.m_objsense == MINIMIZE) {
        pcVar12 = "Minimize\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar16->m_streams[pSVar16->m_verbosity],pcVar12,9);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,local_138);
    }
    added2Set(this,(SVSetBase<double> *)this,&local_5b8->super_SVSetBase<double>,
              (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])
              (this,(ulong)(uint)(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                                 thenum);
  }
  if (local_5b0 == (NameSet *)0x0) {
    NameSet::~NameSet(local_620);
    free(local_620);
    local_620 = (NameSet *)0x0;
  }
  if (local_5a8 == (NameSet *)0x0) {
    NameSet::~NameSet(local_5f8);
    free(local_5f8);
  }
  return (bool)(local_598.m_has_error ^ 1);
}

Assistant:

inline
bool SPxLPBase<R>::readMPS(
   std::istream& p_input,           ///< input stream.
   NameSet*      p_rnames,          ///< row names.
   NameSet*      p_cnames,          ///< column names.
   DIdxSet*      p_intvars)         ///< integer variables.
{
   LPRowSetBase<R>& rset = *this;
   LPColSetBase<R>& cset = *this;
   NameSet* rnames;
   NameSet* cnames;

   if(p_cnames)
      cnames = p_cnames;
   else
   {
      cnames = nullptr;
      spx_alloc(cnames);
      cnames = new(cnames) NameSet();
   }

   cnames->clear();

   if(p_rnames)
      rnames = p_rnames;
   else
   {
      try
      {
         rnames = nullptr;
         spx_alloc(rnames);
         rnames = new(rnames) NameSet();
      }
      catch(const SPxMemoryException& x)
      {
         if(!p_cnames)
         {
            cnames->~NameSet();
            spx_free(cnames);
         }

         throw x;
      }
   }

   rnames->clear();

   SPxLPBase<R>::clear(); // clear the LP.

   cset.memRemax(Init_NZos);
   cset.reMax(Init_Cols);

   MPSInput mps(p_input);

   MPSreadName(mps, spxout);

   if(mps.section() == MPSInput::OBJSEN)
      MPSreadObjsen(mps);

   if(mps.section() == MPSInput::OBJNAME)
      MPSreadObjname(mps);

   if(mps.section() == MPSInput::ROWS)
      MPSreadRows(mps, rset, *rnames, spxout);

   addedRows(rset.num());

   if(mps.section() == MPSInput::COLUMNS)
      MPSreadCols(mps, rset, *rnames, cset, *cnames, p_intvars);

   if(mps.section() == MPSInput::RHS)
      MPSreadRhs(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::RANGES)
      MPSreadRanges(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::BOUNDS)
      MPSreadBounds(mps, cset, *cnames, p_intvars, spxout);

   if(mps.section() != MPSInput::ENDATA)
      mps.syntaxError();

   if(mps.hasError())
      clear();
   else
   {
      changeSense(mps.objSense() == MPSInput::MINIMIZE ? SPxLPBase<R>::MINIMIZE : SPxLPBase<R>::MAXIMIZE);

      SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD06 Objective sense: " << ((mps.objSense() ==
                    MPSInput::MINIMIZE) ? "Minimize\n" : "Maximize\n"));

      added2Set(
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPRowSetBase<R>*>(this))),
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPColSetBase<R>*>(this))),
         cset.num());
      addedCols(cset.num());

      assert(isConsistent());
   }

   if(p_cnames == nullptr)
   {
      cnames->~NameSet();
      spx_free(cnames);
   }

   if(p_rnames == nullptr)
   {
      rnames->~NameSet();
      spx_free(rnames);
   }

   return !mps.hasError();
}